

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DisableIffSyntax::setChild(DisableIffSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 5) {
    switch(index) {
    case 0:
      TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->disable).kind = TVar2.kind;
      (this->disable).field_0x2 = TVar2._2_1_;
      (this->disable).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
      (this->disable).rawLen = TVar2.rawLen;
      (this->disable).info = TVar2.info;
      break;
    case 1:
      TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->iff).kind = TVar2.kind;
      (this->iff).field_0x2 = TVar2._2_1_;
      (this->iff).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
      (this->iff).rawLen = TVar2.rawLen;
      (this->iff).info = TVar2.info;
      break;
    case 2:
      TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openParen).kind = TVar2.kind;
      (this->openParen).field_0x2 = TVar2._2_1_;
      (this->openParen).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
      (this->openParen).rawLen = TVar2.rawLen;
      (this->openParen).info = TVar2.info;
      break;
    case 3:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1)
        ;
      }
      not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
                ((not_null<slang::syntax::ExpressionSyntax*> *)&local_b8,
                 (ExpressionSyntax **)&local_d8);
      (this->expr).ptr = (ExpressionSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 4:
      TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeParen).kind = TVar2.kind;
      (this->closeParen).field_0x2 = TVar2._2_1_;
      (this->closeParen).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
      (this->closeParen).rawLen = TVar2.rawLen;
      (this->closeParen).info = TVar2.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x1180);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DisableIffSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: disable = child.token(); return;
        case 1: iff = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: closeParen = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}